

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

object * gc_move(mobject *ptr)

{
  mobject *pmVar1;
  object *poVar2;
  uintptr_t uVar3;
  undefined8 uVar4;
  mobject *pmVar5;
  uint uVar6;
  object *poVar7;
  bool bVar8;
  uint local_34;
  int isz;
  int sz;
  mobject *replacement;
  mobject *new_address;
  mobject *previous_object;
  mobject *old_address;
  mobject *ptr_local;
  
  new_address = (mobject *)0x0;
  previous_object = ptr;
LAB_001090ee:
  do {
    while (pmVar5 = previous_object, ((ulong)previous_object & 1) != 0) {
      _isz = (object *)previous_object;
LAB_0010936f:
      previous_object = new_address;
      while( true ) {
        if (previous_object == (mobject *)0x0) {
          return _isz;
        }
        if (((previous_object->header & 2) == 0) &&
           ((previous_object->header >> 2 & 0x3fffffff) != 0)) break;
        poVar7 = (object *)previous_object[1].header;
        poVar2 = poVar7->class;
        poVar7->class = _isz;
        previous_object[1].header = (uintptr_t)poVar7;
        _isz = poVar7;
        previous_object = (mobject *)poVar2;
      }
      local_34 = (uint)(previous_object->header >> 2) & 0x3fffffff;
      uVar3 = previous_object[(long)(int)local_34 + 1].header;
      uVar4 = *(undefined8 *)(uVar3 + 8 + (long)(int)local_34 * 8);
      *(object **)(uVar3 + 8 + (long)(int)local_34 * 8) = _isz;
      while( true ) {
        local_34 = local_34 - 1;
        bVar8 = false;
        if (local_34 != 0) {
          bVar8 = previous_object[(long)(int)local_34 + 1].header == 0;
        }
        if (!bVar8) break;
        *(undefined8 *)(uVar3 + 8 + (long)(int)local_34 * 8) = 0;
      }
      previous_object->header = (ulong)(local_34 * 4);
      previous_object->header = previous_object->header | 1;
      *(undefined8 *)(uVar3 + 8 + (long)(int)local_34 * 8) = uVar4;
      new_address = previous_object;
      pmVar5 = (mobject *)previous_object[(long)(int)local_34 + 1].header;
      previous_object[(long)(int)local_34 + 1].header = uVar3;
      previous_object = pmVar5;
    }
    if (((long)memoryBase <= (long)previous_object) && ((long)previous_object <= (long)memoryTop)) {
      error_impl("gc_move",0x99,
                 "gc_move(): GC invariant failure -- old address points to new space %p",
                 previous_object);
      goto LAB_001090ee;
    }
    if (((long)previous_object < (long)oldBase) || ((long)oldTop < (long)previous_object)) {
      _isz = (object *)previous_object;
      goto LAB_0010936f;
    }
    if ((previous_object->header & 1) != 0) {
      if ((previous_object->header & 2) == 0) {
        _isz = (object *)
               previous_object[(long)(int)((uint)(previous_object->header >> 2) & 0x3fffffff) + 1].
               header;
      }
      else {
        _isz = (object *)previous_object[1].header;
      }
      goto LAB_0010936f;
    }
    if ((previous_object->header & 2) == 0) {
      uVar6 = (uint)(previous_object->header >> 2) & 0x3fffffff;
      poVar7 = (object *)((long)&memoryPointer->header + (long)(int)((uVar6 + 2) * -8));
      memoryPointer = poVar7;
      poVar7->header = (ulong)(uVar6 << 2);
      previous_object->header = previous_object->header | 1;
      (&poVar7->class)[(int)uVar6] = (object *)new_address;
      pmVar1 = (mobject *)previous_object[(long)(int)uVar6 + 1].header;
      previous_object[(long)(int)uVar6 + 1].header = (uintptr_t)poVar7;
      previous_object = pmVar1;
    }
    else {
      uVar6 = (uint)(previous_object->header >> 2) & 0x3fffffff;
      local_34 = (uVar6 + 7) / 8;
      poVar7 = (object *)((long)&memoryPointer->header + (long)(int)((local_34 + 2) * -8));
      memoryPointer = poVar7;
      poVar7->header = (ulong)(uVar6 << 2);
      poVar7->header = poVar7->header | 2;
      for (; local_34 != 0; local_34 = local_34 - 1) {
        (&poVar7->class)[(int)local_34] = (object *)previous_object[(long)(int)local_34 + 1].header;
      }
      previous_object->header = previous_object->header | 1;
      poVar7->class = (object *)new_address;
      pmVar1 = (mobject *)previous_object[1].header;
      previous_object[1].header = (uintptr_t)poVar7;
      previous_object = pmVar1;
    }
    new_address = pmVar5;
  } while( true );
}

Assistant:

static struct object *gc_move(struct mobject *ptr)
{
    struct mobject *old_address = ptr, *previous_object = 0,*new_address = 0, *replacement  = 0;
    int sz;

    while (1) {

        /*
         * part 1.  Walking down the tree
         * keep stacking objects to be moved until we find
         * one that we can handle
         */
        for (;;) {
            /*
             * SmallInt's are not proper memory pointers,
             * so catch them first.  Their "object pointer"
             * value can be used as-is in the new space.
             */
            if (IS_SMALLINT(old_address)) {
                replacement = old_address;
                old_address = previous_object;
                break;

                /*
                 * If we find a pointer in the current space
                 * to the new space (other than indirections) then
                 * something is very wrong
                 */
            } else if (IN_NEWSPACE(old_address)) {
                error("gc_move(): GC invariant failure -- old address points to new space %p", old_address);

                /* else see if not  in old space */
            } else if (!IN_OLDSPACE(old_address)) {
                replacement = old_address;
                old_address = previous_object;
                break;

                /* else see if already forwarded */
            } else if (IS_GCDONE(old_address))  {
                if (IS_BINOBJ(old_address)) {
                    /* reuse class element. */
                    replacement = old_address->data[0];
                } else {
                    sz = SIZE(old_address);
                    replacement = old_address->data[sz];
                }
                old_address = previous_object;
                break;

                /* else see if binary object */
            } else if (IS_BINOBJ(old_address)) {
                int isz;

                isz = SIZE(old_address);
                sz = TO_WORDS(isz);
                memoryPointer = WORDSDOWN(memoryPointer,
                                          sz + 2);
                new_address = (struct mobject *)memoryPointer;
                SET_SIZE(new_address, isz);
                SET_BINOBJ(new_address);
                /* FIXME - use memcpy */
                while (sz) {
                    new_address->data[sz] =
                        old_address->data[sz];
                    sz--;
                }
                SET_GCDONE(old_address);
                new_address->data[0] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[0];
                previous_object->data[0] = new_address;
                /* now go chase down class pointer */

                /* must be non-binary object */
            } else  {
                sz = SIZE(old_address);
                memoryPointer = WORDSDOWN(memoryPointer,
                                          sz + 2);
                new_address = (struct mobject *)memoryPointer;
                SET_SIZE(new_address, sz);
                SET_GCDONE(old_address);
                new_address->data[sz] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[sz];
                previous_object->data[sz] = new_address;
            }
        }

        /*
         * part 2.  Fix up pointers,
         * move back up tree as long as possible
         * old_address points to an object in the old space,
         * which in turns points to an object in the new space,
         * which holds a pointer that is now to be replaced.
         * the value in replacement is the new value
         */
        for (;;) {
            /* backed out entirely */
            if (old_address == 0) {
                return (struct object *) replacement;
            }

            /* case 1, binary or last value */
            if (IS_BINOBJ(old_address) ||
                (SIZE(old_address) == 0)) {

                /* fix up class pointer */
                new_address = old_address->data[0];
                previous_object = new_address->data[0];
                new_address->data[0] = replacement;
                old_address->data[0] = new_address;
                replacement = new_address;
                old_address = previous_object;
            } else {
                sz = SIZE(old_address);
                new_address = old_address->data[sz];
                previous_object = new_address->data[sz];
                new_address->data[sz] = replacement;
                sz--;

                /*
                 * quick cheat for recovering zero fields
                 */
                while (sz && (old_address->data[sz] == 0)) {
                    new_address->data[sz--] = 0;
                }

                SET_SIZE(old_address, sz);
                SET_GCDONE(old_address);
                new_address->data[sz] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[sz];
                previous_object->data[sz] = new_address;
                break; /* go track down this value */
            }
        }
    }

    /* make the compiler happy */
    return (struct object *)0;
}